

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O3

UINT8 device_start_k054539(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA *pDVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  UINT8 UVar4;
  DEV_DATA DVar5;
  long lVar6;
  void *pvVar7;
  k054539_state *info;
  double dVar8;
  undefined1 auVar9 [16];
  long lVar10;
  
  DVar5.chipInf = calloc(1,0xbd0);
  if ((DEV_DATA *)DVar5.chipInf == (DEV_DATA *)0x0) {
    UVar4 = 0xff;
  }
  else {
    lVar6 = 0x110;
    do {
      pDVar1 = (DEV_DATA *)((long)DVar5.chipInf + lVar6 * 8);
      pDVar1->chipInf = (void *)0x3ff0000000000000;
      pDVar1[1].chipInf = (void *)0x3ff0000000000000;
      lVar6 = lVar6 + 2;
    } while (lVar6 != 0x118);
    lVar6 = 0;
    do {
      dVar8 = pow(10.0,((double)(int)lVar6 * -36.0 * 0.015625) / 20.0);
      *(double *)((long)DVar5.chipInf + lVar6 * 8 + 8) = dVar8 * 0.25;
      auVar3 = _DAT_001733d0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
    lVar6 = 0;
    auVar9 = _DAT_001733c0;
    do {
      if (SUB164(auVar9 ^ auVar3,4) == -0x80000000 && SUB164(auVar9 ^ auVar3,0) < -0x7ffffff1) {
        *(double *)((long)DVar5.chipInf + lVar6 * 8 + 0x808) =
             SQRT((double)(int)lVar6) / 3.7416573867739413;
        *(double *)((long)DVar5.chipInf + lVar6 * 8 + 0x810) =
             SQRT((double)((int)lVar6 + 1)) / 3.7416573867739413;
      }
      lVar6 = lVar6 + 2;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
    } while (lVar6 != 0x10);
    uVar2 = cfg->clock;
    *(uint *)((long)DVar5.chipInf + 0xbcc) = uVar2;
    pvVar7 = malloc(0x4000);
    ((DEV_DATA *)((long)DVar5.chipInf + 0xb10))->chipInf = pvVar7;
    *(undefined1 (*) [16])((long)DVar5.chipInf + 0xb30) = (undefined1  [16])0x0;
    *(UINT8 *)&((DEV_DATA *)((long)DVar5.chipInf + 0x8d8))->chipInf = cfg->flags;
    UVar4 = '\0';
    ((DEV_DATA *)((long)DVar5.chipInf + 0xbc0))->chipInf = (void *)0x0;
    *(void **)DVar5.chipInf = DVar5.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar5.chipInf;
    retDevInf->sampleRate = uVar2 / 0x180;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar4;
}

Assistant:

static UINT8 device_start_k054539(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	int i;
	k054539_state *info;

	info = (k054539_state *)calloc(1, sizeof(k054539_state));
	if (info == NULL)
		return 0xFF;

	//info->timer = timer_alloc(0);

	// resolve / bind callbacks
	//info->timer_handler.resolve_safe();
	//info->apan_cb.bind_relative_to(*owner());

	for (i = 0; i < 8; i++)
		info->gain[i] = 1.0;

	info->flags = K054539_RESET_FLAGS;

	/*
	    I've tried various equations on volume control but none worked consistently.
	    The upper four channels in most MW/GX games simply need a significant boost
	    to sound right. For example, the bass and smash sound volumes in Violent Storm
	    have roughly the same values and the voices in Tokimeki Puzzledama are given
	    values smaller than those of the hihats. Needless to say the two K054539 chips
	    in Mystic Warriors are completely out of balance. Rather than forcing a
	    "one size fits all" function to the voltab the current invert exponential
	    appraoch seems most appropriate.
	*/
	// Factor the 1/4 for the number of channels in the volume (1/8 is too harsh, 1/2 gives clipping)
	// vol=0 -> no attenuation, vol=0x40 -> -36dB
	for(i=0; i<256; i++)
		info->voltab[i] = pow(10.0, (-36.0 * (double)i / (double)0x40) / 20.0) / 4.0;

	// Pan table for the left channel
	// Right channel is identical with inverted index
	// Formula is such that pan[i]**2+pan[0xe-i]**2 = 1 (constant output power)
	// and pan[0xe] = 1 (full panning)
	for(i=0; i<0xf; i++)
		info->pantab[i] = sqrt((double)i) / sqrt((double)0xe);

	info->clock = cfg->clock;

	info->flags |= K054539_UPDATE_AT_KEYON; //* make it default until proven otherwise

	info->ram = (UINT8*)malloc(0x4000);
	info->rom = NULL;
	info->rom_size = 0x00;
	info->rom_mask = 0x00;

	k054539_init_flags(info, cfg->flags);

	k054539_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->clock / 384, &devDef);

	return 0x00;
}